

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_> *
despot::logging::InitializeLogStreams(void)

{
  log_ostream *plVar1;
  vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_> *in_RDI;
  allocator_type local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::vector<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>::vector
            (in_RDI,6,&local_b9);
  *(in_RDI->super__Vector_base<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>).
   _M_impl.super__Vector_impl_data._M_start = (log_ostream *)0x0;
  plVar1 = (log_ostream *)operator_new(0x1a0);
  std::__cxx11::string::string((string *)&local_38,(string *)(markers__abi_cxx11_ + 0x20));
  log_ostream::log_ostream(plVar1,(ostream *)&std::cerr,&local_38);
  (in_RDI->super__Vector_base<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>).
  _M_impl.super__Vector_impl_data._M_start[1] = plVar1;
  std::__cxx11::string::~string((string *)&local_38);
  plVar1 = (log_ostream *)operator_new(0x1a0);
  std::__cxx11::string::string((string *)&local_58,(string *)(markers__abi_cxx11_ + 0x40));
  log_ostream::log_ostream(plVar1,(ostream *)&std::cerr,&local_58);
  (in_RDI->super__Vector_base<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>).
  _M_impl.super__Vector_impl_data._M_start[2] = plVar1;
  std::__cxx11::string::~string((string *)&local_58);
  plVar1 = (log_ostream *)operator_new(0x1a0);
  std::__cxx11::string::string((string *)&local_78,(string *)(markers__abi_cxx11_ + 0x60));
  log_ostream::log_ostream(plVar1,(ostream *)&std::cerr,&local_78);
  (in_RDI->super__Vector_base<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>).
  _M_impl.super__Vector_impl_data._M_start[3] = plVar1;
  std::__cxx11::string::~string((string *)&local_78);
  plVar1 = (log_ostream *)operator_new(0x1a0);
  std::__cxx11::string::string((string *)&local_98,(string *)(markers__abi_cxx11_ + 0x80));
  log_ostream::log_ostream(plVar1,(ostream *)&std::cerr,&local_98);
  (in_RDI->super__Vector_base<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>).
  _M_impl.super__Vector_impl_data._M_start[4] = plVar1;
  std::__cxx11::string::~string((string *)&local_98);
  plVar1 = (log_ostream *)operator_new(0x1a0);
  std::__cxx11::string::string((string *)&local_b8,(string *)(markers__abi_cxx11_ + 0xa0));
  log_ostream::log_ostream(plVar1,(ostream *)&std::cerr,&local_b8);
  (in_RDI->super__Vector_base<despot::log_ostream_*,_std::allocator<despot::log_ostream_*>_>).
  _M_impl.super__Vector_impl_data._M_start[5] = plVar1;
  std::__cxx11::string::~string((string *)&local_b8);
  return in_RDI;
}

Assistant:

vector<log_ostream*> logging::InitializeLogStreams() {
	vector<log_ostream*> streams(6);

	streams[NONE] = NULL;
	streams[ERROR] = new log_ostream(cerr, markers_[ERROR]);
	streams[WARN] = new log_ostream(cerr, markers_[WARN]);
	streams[INFO] = new log_ostream(cerr, markers_[INFO]);
	streams[DEBUG] = new log_ostream(cerr, markers_[DEBUG]);
	streams[VERBOSE] = new log_ostream(cerr, markers_[VERBOSE]);

	return streams;
}